

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycled.hpp
# Opt level: O2

void __thiscall
Lib::
Recycled<Lib::DHSet<Kernel::Unit_*,_Lib::DefaultHash,_Lib::DefaultHash2>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
::~Recycled(Recycled<Lib::DHSet<Kernel::Unit_*,_Lib::DefaultHash,_Lib::DefaultHash2>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
            *this)

{
  _Head_base<0UL,_Lib::DHSet<Kernel::Unit_*,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_false> this_00;
  Stack<std::unique_ptr<Lib::DHSet<Kernel::Unit_*,_Lib::DefaultHash,_Lib::DefaultHash2>,_std::default_delete<Lib::DHSet<Kernel::Unit_*,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>_>
  *this_01;
  _Head_base<0UL,_Lib::DHSet<Kernel::Unit_*,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_false> local_10
  ;
  
  this_00._M_head_impl =
       (this->_self)._M_t.
       super___uniq_ptr_impl<Lib::DHSet<Kernel::Unit_*,_Lib::DefaultHash,_Lib::DefaultHash2>,_std::default_delete<Lib::DHSet<Kernel::Unit_*,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_Lib::DHSet<Kernel::Unit_*,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_std::default_delete<Lib::DHSet<Kernel::Unit_*,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
       .
       super__Head_base<0UL,_Lib::DHSet<Kernel::Unit_*,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_false>
       ._M_head_impl;
  if (((&(this_00._M_head_impl)->_map !=
        (DHMap<Kernel::Unit_*,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2> *)0x0) &&
      (0 < *(int *)((long)&(this_00._M_head_impl)->_map + 0x10))) &&
     (Recycled<Lib::DHSet<Kernel::Unit*,Lib::DefaultHash,Lib::DefaultHash2>,Lib::DefaultReset,Lib::DefaultKeepRecycled>
      ::memAlive == '\x01')) {
    DHMap<Kernel::Unit_*,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2>::reset
              (&(this_00._M_head_impl)->_map);
    this_01 = mem();
    local_10._M_head_impl =
         (this->_self)._M_t.
         super___uniq_ptr_impl<Lib::DHSet<Kernel::Unit_*,_Lib::DefaultHash,_Lib::DefaultHash2>,_std::default_delete<Lib::DHSet<Kernel::Unit_*,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_Lib::DHSet<Kernel::Unit_*,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_std::default_delete<Lib::DHSet<Kernel::Unit_*,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
         .
         super__Head_base<0UL,_Lib::DHSet<Kernel::Unit_*,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_false>
         ._M_head_impl;
    (this->_self)._M_t.
    super___uniq_ptr_impl<Lib::DHSet<Kernel::Unit_*,_Lib::DefaultHash,_Lib::DefaultHash2>,_std::default_delete<Lib::DHSet<Kernel::Unit_*,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_Lib::DHSet<Kernel::Unit_*,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_std::default_delete<Lib::DHSet<Kernel::Unit_*,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
    .super__Head_base<0UL,_Lib::DHSet<Kernel::Unit_*,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_false>
    ._M_head_impl = (DHSet<Kernel::Unit_*,_Lib::DefaultHash,_Lib::DefaultHash2> *)0x0;
    Stack<std::unique_ptr<Lib::DHSet<Kernel::Unit_*,_Lib::DefaultHash,_Lib::DefaultHash2>,_std::default_delete<Lib::DHSet<Kernel::Unit_*,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>_>
    ::push(this_01,(unique_ptr<Lib::DHSet<Kernel::Unit_*,_Lib::DefaultHash,_Lib::DefaultHash2>,_std::default_delete<Lib::DHSet<Kernel::Unit_*,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
                    *)&local_10);
    std::
    unique_ptr<Lib::DHSet<Kernel::Unit_*,_Lib::DefaultHash,_Lib::DefaultHash2>,_std::default_delete<Lib::DHSet<Kernel::Unit_*,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
    ::~unique_ptr((unique_ptr<Lib::DHSet<Kernel::Unit_*,_Lib::DefaultHash,_Lib::DefaultHash2>,_std::default_delete<Lib::DHSet<Kernel::Unit_*,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
                   *)&local_10);
  }
  std::
  unique_ptr<Lib::DHSet<Kernel::Unit_*,_Lib::DefaultHash,_Lib::DefaultHash2>,_std::default_delete<Lib::DHSet<Kernel::Unit_*,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
  ::~unique_ptr(&this->_self);
  return;
}

Assistant:

~Recycled()
  {
    if (IF_USE_PTRS(_self, true) && _keep(self()) && memAlive) {
      _reset(self());
      mem().push(std::move(_self));
    }
  }